

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

uint32_t __thiscall
llvm::DWARFDebugLine::LineTable::lookupAddressImpl(LineTable *this,SectionedAddress Address)

{
  bool bVar1;
  pointer pSVar2;
  reference Seq;
  bool bVar3;
  __normal_iterator<const_llvm::DWARFDebugLine::Sequence_*,_std::vector<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>_>
  local_60;
  __normal_iterator<const_llvm::DWARFDebugLine::Sequence_*,_std::vector<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>_>
  local_58;
  SequenceIter It;
  Sequence Sequence;
  LineTable *this_local;
  SectionedAddress Address_local;
  
  DWARFDebugLine::Sequence::Sequence((Sequence *)&It);
  local_58._M_current =
       (Sequence *)
       upper_bound<std::vector<llvm::DWARFDebugLine::Sequence,std::allocator<llvm::DWARFDebugLine::Sequence>>const&,llvm::DWARFDebugLine::Sequence&,bool(*)(llvm::DWARFDebugLine::Sequence_const&,llvm::DWARFDebugLine::Sequence_const&)>
                 (&this->Sequences,(Sequence *)&It,DWARFDebugLine::Sequence::orderByHighPC);
  local_60._M_current =
       (Sequence *)
       std::vector<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
       ::end(&this->Sequences);
  bVar1 = __gnu_cxx::operator==(&local_58,&local_60);
  bVar3 = true;
  if (!bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_llvm::DWARFDebugLine::Sequence_*,_std::vector<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>_>
             ::operator->(&local_58);
    bVar3 = pSVar2->SectionIndex != Address.SectionIndex;
  }
  if (bVar3) {
    Address_local.SectionIndex._4_4_ = this->UnknownRowIndex;
  }
  else {
    Seq = __gnu_cxx::
          __normal_iterator<const_llvm::DWARFDebugLine::Sequence_*,_std::vector<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>_>
          ::operator*(&local_58);
    Address_local.SectionIndex._4_4_ = findRowInSeq(this,Seq,Address);
  }
  return Address_local.SectionIndex._4_4_;
}

Assistant:

uint32_t DWARFDebugLine::LineTable::lookupAddressImpl(
    object::SectionedAddress Address) const {
  // First, find an instruction sequence containing the given address.
  DWARFDebugLine::Sequence Sequence;
  Sequence.SectionIndex = Address.SectionIndex;
  Sequence.HighPC = Address.Address;
  SequenceIter It = llvm::upper_bound(Sequences, Sequence,
                                      DWARFDebugLine::Sequence::orderByHighPC);
  if (It == Sequences.end() || It->SectionIndex != Address.SectionIndex)
    return UnknownRowIndex;
  return findRowInSeq(*It, Address);
}